

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCCtx_usingCDict
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_buffered_policy_e zbuff)

{
  int iVar1;
  ZSTD_buffered_policy_e zbuff_local;
  U64 pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CCtx *cctx_local;
  
  iVar1 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
  if (iVar1 == 0) {
    cctx_local = (ZSTD_CCtx *)ZSTD_resetCCtx_byCopyingCDict(cctx,cdict,params,pledgedSrcSize,zbuff);
  }
  else {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_resetCCtx_byAttachingCDict(cctx,cdict,params,pledgedSrcSize,zbuff);
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_resetCCtx_usingCDict(ZSTD_CCtx* cctx,
                            const ZSTD_CDict* cdict,
                            ZSTD_CCtx_params params,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{

    DEBUGLOG(4, "ZSTD_resetCCtx_usingCDict (pledgedSrcSize=%u)",
                (unsigned)pledgedSrcSize);

    if (ZSTD_shouldAttachDict(cdict, params, pledgedSrcSize)) {
        return ZSTD_resetCCtx_byAttachingCDict(
            cctx, cdict, params, pledgedSrcSize, zbuff);
    } else {
        return ZSTD_resetCCtx_byCopyingCDict(
            cctx, cdict, params, pledgedSrcSize, zbuff);
    }
}